

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

size_t CCharmapToLocal::source_esc_cb(wchar_t ch,char **dest,size_t *len)

{
  ulong __n;
  char buf [7];
  char local_27 [7];
  
  sprintf(local_27,"\\u%04x",ch);
  __n = *len;
  if (5 < __n) {
    __n = 6;
  }
  memcpy(*dest,local_27,__n);
  *dest = *dest + __n;
  *len = *len - __n;
  return 6;
}

Assistant:

size_t CCharmapToLocal::source_esc_cb(wchar_t ch, char **dest, size_t *len)
{
    char buf[7];
    size_t copylen;
    
    /* prepare our own representation */
    sprintf(buf, "\\u%04x", (unsigned int)ch);

    /* copy the whole thing if possible, but limit to the available space */
    copylen = 6;
    if (copylen > *len)
        copylen = *len;

    /* copy the bytes */
    memcpy(*dest, buf, copylen);

    /* advance the buffer pointers */
    *dest += copylen;
    *len -= copylen;

    /* return the full space needed */
    return 6;
}